

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O3

void anon_unknown.dwarf_2c92::parseComponents(ndicapi *api,char *data)

{
  ushort *puVar1;
  byte bVar2;
  short sVar3;
  ushort uVar4;
  ushort uVar5;
  int iVar6;
  int iVar7;
  ushort uVar8;
  uint uVar9;
  float *pfVar10;
  long lVar11;
  ulong uVar12;
  char (*pacVar13) [20];
  ulong uVar14;
  uint uVar15;
  ushort *puVar16;
  float *pfVar17;
  ulong uVar18;
  short sVar19;
  
  api->Bx2GBFVersion = *(unsigned_short *)data;
  sVar3 = *(short *)(data + 2);
  if (sVar3 != 0) {
    puVar16 = (ushort *)(data + 4);
    sVar19 = 0;
    do {
      uVar4 = *puVar16;
      iVar6 = *(int *)(puVar16 + 1);
      uVar5 = puVar16[5];
      iVar7 = (uint)*(byte *)((long)puVar16 + 9) * 0x100;
      uVar8 = puVar16[4];
      uVar9 = iVar7 + (uint)uVar5 * 0x10000 | (uint)(byte)uVar8;
      puVar1 = puVar16 + 6;
      if (uVar4 < 3) {
        if (uVar4 == 1) {
          api->Bx2FrameType = (uchar)puVar16[6];
          api->Bx2FrameSequenceIndex = *(uchar *)((long)puVar16 + 0xd);
          api->Bx2FrameNumber = *(uint *)(puVar16 + 8);
          puVar16 = puVar16 + 10;
          lVar11 = 0x48a0;
          do {
            *(char *)((long)&api->SerialDevice + lVar11) = (char)*puVar16;
            puVar16 = (ushort *)((long)puVar16 + 1);
            lVar11 = lVar11 + -1;
          } while (lVar11 != 0x4898);
          parseComponents(api,(char *)puVar16);
        }
        else if (uVar4 == 2) {
          uVar15 = 0x18;
          if (uVar9 < 0x18) {
            uVar15 = uVar9;
          }
          api->Bx2HandleCount = uVar15;
          if (uVar9 != 0) {
            uVar12 = (ulong)((uint)uVar5 * 0x10000 + iVar7 + (uint)(byte)uVar8);
            if (0x17 < uVar12) {
              uVar12 = 0x18;
            }
            uVar14 = 0;
            pfVar10 = api->Bx2Transforms[0] + 7;
            puVar16 = puVar1;
            do {
              api->Bx2Handles[uVar14] = *puVar16;
              bVar2 = *(byte *)((long)puVar16 + 3);
              api->Bx2HandlesStatus[uVar14] = puVar16[1];
              if ((bVar2 & 2) != 0) {
                api->Bx2HandleAveragingEnabled[uVar14] = true;
              }
              if ((bVar2 & 1) == 0) {
                (*(float (*) [8])(pfVar10 + -7))[0] = *(float *)(puVar16 + 2);
                pfVar10[-6] = *(float *)(puVar16 + 4);
                pfVar10[-5] = *(float *)(puVar16 + 6);
                pfVar10[-4] = *(float *)(puVar16 + 8);
                pfVar10[-3] = *(float *)(puVar16 + 10);
                pfVar10[-2] = *(float *)(puVar16 + 0xc);
                pfVar10[-1] = *(float *)(puVar16 + 0xe);
                *pfVar10 = *(float *)(puVar16 + 0x10);
                puVar16 = puVar16 + 0x12;
              }
              else {
                puVar16 = puVar16 + 2;
              }
              uVar14 = uVar14 + 1;
              pfVar10 = pfVar10 + 8;
            } while (uVar12 != uVar14);
          }
        }
      }
      else if (uVar4 == 3) {
        if (uVar9 != 0) {
          uVar12 = (ulong)uVar9;
          if (0x17 < uVar9) {
            uVar12 = 0x18;
          }
          uVar14 = 0;
          pacVar13 = api->Bx2_3DMarkerStatus;
          pfVar10 = api->Bx2_3DMarkerPosition[0][0] + 2;
          puVar16 = puVar1;
          do {
            uVar4 = puVar16[1];
            puVar16 = puVar16 + 2;
            if ((ulong)uVar4 != 0) {
              uVar18 = 0;
              pfVar17 = pfVar10;
              do {
                (*pacVar13)[uVar18] = (char)*puVar16;
                (*(float (*) [3])(pfVar17 + -2))[0] = *(float *)(puVar16 + 2);
                pfVar17[-1] = *(float *)(puVar16 + 4);
                *pfVar17 = *(float *)(puVar16 + 6);
                uVar18 = uVar18 + 1;
                pfVar17 = pfVar17 + 3;
                puVar16 = puVar16 + 8;
              } while (uVar4 != uVar18);
            }
            uVar14 = uVar14 + 1;
            pfVar10 = pfVar10 + 0x3c;
            pacVar13 = pacVar13 + 1;
          } while (uVar14 != uVar12);
        }
      }
      else if ((uVar4 == 0x12) && (api->Bx2SystemAlertsCount = uVar9, uVar9 != 0)) {
        lVar11 = 0;
        do {
          uVar15 = (uint)lVar11 & 0xffff;
          api->Bx2SystemAlerts[uVar15][0] = puVar1[lVar11 * 2];
          api->Bx2SystemAlerts[uVar15][1] = puVar16[lVar11 * 2 + 7];
          lVar11 = lVar11 + 1;
        } while (((uint)lVar11 & 0xffff) < uVar9);
      }
      puVar16 = (ushort *)((long)puVar1 + (ulong)(iVar6 - 0xc));
      sVar19 = sVar19 + 1;
    } while (sVar19 != sVar3);
  }
  return;
}

Assistant:

void parseComponents(ndicapi* api, const char* data)
  {
    const char* componentIndex = data;

    // GBF version
    api->Bx2GBFVersion = (unsigned char)componentIndex[1] << 8 | (unsigned char)componentIndex[0];
    componentIndex += 2;
    // GBF Component count
    unsigned short componentCount = (unsigned char)componentIndex[1] << 8 | (unsigned char)componentIndex[0];
    componentIndex += 2;

    unsigned int totalSkipLength(0);
    for (unsigned short i = 0; i < componentCount; ++i)
    {
      // Component
      unsigned short componentType = (unsigned char)componentIndex[1] << 8 | (unsigned char)componentIndex[0];
      componentIndex += 2;
      unsigned int componentSize = (unsigned char)componentIndex[3] << 24 | (unsigned char)componentIndex[2] << 16 | (unsigned char)componentIndex[1] << 8 | (unsigned char)componentIndex[0];
      componentIndex += 4;
      unsigned short itemOption = (unsigned char)componentIndex[1] << 8 | (unsigned char)componentIndex[0];
      componentIndex += 2;
      unsigned int itemCount = (unsigned char)componentIndex[3] << 24 | (unsigned char)componentIndex[2] << 16 | (unsigned char)componentIndex[1] << 8 | (unsigned char)componentIndex[0];
      componentIndex += 4;

      switch (componentType)
      {
      case NDI_COMPONENTID_FRAME:
        parseFrameComponent(api, componentIndex, itemOption, itemCount);
        break;
      case NDI_COMPONENTID_6D:
        parse6DComponent(api, componentIndex, itemOption, itemCount);
        break;
      case NDI_COMPONENTID_3D:
        parse3DComponent(api, componentIndex, itemOption, itemCount);
        break;
      case NDI_COMPONENTID_1D:
        parse1DComponent(api, componentIndex, itemOption, itemCount);
        break;
      case NDI_COMPONENTID_2D:
        parse2DComponent(api, componentIndex, itemOption, itemCount);
        break;
      case NDI_COMPONENTID_LINE_SEP:
        parseLineSepComponent(api, componentIndex, itemOption, itemCount);
        break;
      case NDI_COMPONENTID_3D_ERROR:
        parse3DErrorComponent(api, componentIndex, itemOption, itemCount);
        break;
      case NDI_COMPONENTID_IMAGE:
        parse1DImageComponent(api, componentIndex, itemOption, itemCount);
        break;
      case NDI_COMPONENTID_UV:
        parseUVComponent(api, componentIndex, itemOption, itemCount);
        break;
      case NDI_COMPONENTID_SYS_ALERT:
        parseSystemAlertComponent(api, componentIndex, itemOption, itemCount);
        break;
      default:
        // Unknown component type, do nothing
        break;
      }

      componentIndex += componentSize - 12; // skip component size - header size
    }
  }